

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

ProcessorBase * __thiscall
soul::AST::Scope::findSingleMatchingProcessor(Scope *this,QualifiedIdentifier *name)

{
  ModuleBase *pMVar1;
  ProcessorBase *pPVar2;
  CompileMessage local_a0;
  IdentifierPath local_68;
  
  pMVar1 = findSingleMatchingSubModule(this,name);
  pPVar2 = (ProcessorBase *)__dynamic_cast(pMVar1,&ModuleBase::typeinfo,&ProcessorBase::typeinfo,0);
  if (pPVar2 != (ProcessorBase *)0x0) {
    return pPVar2;
  }
  IdentifierPath::operator+
            (&local_68,&name->pathPrefix,
             &((name->pathSections).
               super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
               ._M_impl.super__Vector_impl_data._M_start)->path);
  CompileMessageHelpers::createMessage<soul::IdentifierPath>
            (&local_a0,syntax,error,"$Q0$ is not a processor or graph",&local_68);
  Context::throwError(&(name->super_Expression).super_Statement.super_ASTObject.context,&local_a0,
                      false);
}

Assistant:

ProcessorBase& findSingleMatchingProcessor (const QualifiedIdentifier& name) const
        {
            auto p = cast<ProcessorBase> (findSingleMatchingSubModule (name));

            if (p == nullptr)
                name.context.throwError (Errors::notAProcessorOrGraph (name.getPath()));

            return *p;
        }